

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void clockCMD(packet_t *recv)

{
  pointer pLVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  Link *link;
  pointer neighborDowned;
  
  currentClock = currentClock + 1;
  floodRoutingTablePacket();
  pLVar1 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  neighborDowned =
       links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
       _M_start;
  do {
    if (neighborDowned == pLVar1) {
      return;
    }
    if ((3 < currentClock - neighborDowned->recvClock) && (neighborDowned->status == 1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"----- link down with : ");
      poVar3 = std::operator<<(poVar3,(string *)neighborDowned);
      poVar3 = std::operator<<(poVar3," -----");
      std::endl<char,std::char_traits<char>>(poVar3);
      neighborDowned->status = 0;
      updateTableForLinkFailure(&neighborDowned->neighbor);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      bVar2 = std::operator!=(&pmVar4->nextHop,"-\t");
      if (!bVar2) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                 ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
        if (pmVar4->cost == 0x7fffffff) goto LAB_001051bb;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,">> ");
      poVar3 = std::operator<<(poVar3,(string *)neighborDowned);
      poVar3 = std::operator<<(poVar3," is still connected via ");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      poVar3 = std::operator<<(poVar3,(string *)&pmVar4->nextHop);
      poVar3 = std::operator<<(poVar3," with cost ");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,pmVar4->cost);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
LAB_001051bb:
    neighborDowned = neighborDowned + 1;
  } while( true );
}

Assistant:

void clockCMD(const packet_t &recv) {
	currentClock++;
	floodRoutingTablePacket();

	for (auto &link : links) {
		if (currentClock - link.recvClock > 3 && link.status == UP) {
			cout << "----- link down with : " << link.neighbor << " -----" << endl;
			link.status = DOWN;
			updateTableForLinkFailure(link.neighbor);
			if (routingMap[link.neighbor].nextHop != NONE || routingMap[link.neighbor].cost != INF) {
				cout << ">> " << link.neighbor << " is still connected via " << routingMap[link.neighbor].nextHop
				     << " with cost " << routingMap[link.neighbor].cost << endl;
			}
		}
	}
}